

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O1

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::visitTry
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this,Try *curr)

{
  BinaryLocation BVar1;
  size_t sVar2;
  Expression **ppEVar3;
  ulong uVar4;
  uint uVar5;
  Try *local_40;
  Expression **local_38;
  
  emit(this,(Expression *)curr);
  local_38 = &curr->body;
  visitPossibleBlockContents(this,curr->body);
  if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements != 0
     ) {
    uVar5 = 1;
    uVar4 = 0;
    do {
      BVar1 = this[4].func[-1].funcLocation.end;
      if (uVar5 == 1) {
        ppEVar3 = local_38;
        if (BVar1 != 5) {
          __assert_fail("scope.kind == Scope::Try",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                        ,0xff,"void wasm::(anonymous namespace)::Poppifier::emitCatch(Try *, Index)"
                       );
        }
      }
      else {
        if (BVar1 != 6) {
          __assert_fail("scope.kind == Scope::Catch",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                        ,0x102,
                        "void wasm::(anonymous namespace)::Poppifier::emitCatch(Try *, Index)");
        }
        if ((curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
            <= (ulong)(uVar5 - 2)) goto LAB_00a03de0;
        ppEVar3 = (curr->catchBodies).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data +
                  (uVar5 - 2);
      }
      anon_unknown_18::Poppifier::patchScope((Poppifier *)this,ppEVar3);
      local_40 = (Try *)CONCAT44(local_40._4_4_,6);
      std::
      vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
      ::emplace_back<wasm::(anonymous_namespace)::Poppifier::Scope::Kind>
                ((vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
                  *)(this + 3),(Kind *)&local_40);
      if ((curr->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar4) goto LAB_00a03de0;
      visitPossibleBlockContents
                (this,(curr->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      data[uVar4]);
      uVar4 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar4 < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                     usedElements);
  }
  sVar2 = (curr->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (sVar2 - (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements == 1) {
    BVar1 = this[4].func[-1].funcLocation.end;
    if (sVar2 == 1) {
      ppEVar3 = local_38;
      if (BVar1 != 5) {
        __assert_fail("scope.kind == Scope::Try",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                      ,0x10b,"void wasm::(anonymous namespace)::Poppifier::emitCatchAll(Try *)");
      }
    }
    else {
      if (BVar1 != 6) {
        __assert_fail("scope.kind == Scope::Catch",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                      ,0x10e,"void wasm::(anonymous namespace)::Poppifier::emitCatchAll(Try *)");
      }
      if (sVar2 == 0) {
LAB_00a03de0:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      ppEVar3 = (curr->catchBodies).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data +
                (sVar2 - 2);
    }
    anon_unknown_18::Poppifier::patchScope((Poppifier *)this,ppEVar3);
    local_40 = (Try *)CONCAT44(local_40._4_4_,6);
    std::
    vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
    ::emplace_back<wasm::(anonymous_namespace)::Poppifier::Scope::Kind>
              ((vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
                *)(this + 3),(Kind *)&local_40);
    sVar2 = (curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar2 == 0) {
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    visitPossibleBlockContents
              (this,(curr->catchBodies).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                    [sVar2 - 1]);
  }
  if ((curr->delegateTarget).super_IString.str._M_str == (char *)0x0) {
    emitScopeEnd(this,(Expression *)curr);
  }
  else {
    if (this[4].func[-1].funcLocation.end != 5) {
      __assert_fail("scope.kind == Scope::Try",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Poppify.cpp"
                    ,0x116,"void wasm::(anonymous namespace)::Poppifier::emitDelegate(Try *)");
    }
    anon_unknown_18::Poppifier::patchScope((Poppifier *)this,local_38);
    local_40 = curr;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
               &this[4].func[-1].effects,(Expression **)&local_40);
  }
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id == 1) {
    emitUnreachable(this);
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitTry(Try* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->body);
  for (Index i = 0; i < curr->catchTags.size(); i++) {
    emitCatch(curr, i);
    visitPossibleBlockContents(curr->catchBodies[i]);
  }
  if (curr->hasCatchAll()) {
    emitCatchAll(curr);
    visitPossibleBlockContents(curr->catchBodies.back());
  }
  if (curr->isDelegate()) {
    emitDelegate(curr);
    // Note that when we emit a delegate we do not need to also emit a scope
    // ending, as the delegate ends the scope.
  } else {
    emitScopeEnd(curr);
  }
  if (curr->type == Type::unreachable) {
    emitUnreachable();
  }
}